

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_double_suite::test_left_skew(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe38;
  double local_1b8;
  value_type local_1b0;
  value_type local_1a8;
  double local_198;
  value_type local_190;
  value_type local_188;
  double local_178;
  value_type local_170;
  value_type local_168;
  double local_158;
  value_type local_150;
  value_type local_148;
  double local_138;
  value_type local_130;
  value_type local_128;
  double local_118;
  value_type local_110;
  value_type local_108;
  double local_f8;
  value_type local_f0;
  value_type local_e8;
  double local_d8;
  value_type local_d0;
  value_type local_c8;
  double local_b8;
  value_type local_b0 [4];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70 [2];
  undefined1 local_60 [8];
  moment_skewness<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_(trial::online::with)3> *)local_60,0.125,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1.0);
  local_70[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x266,"void skewness_double_suite::test_left_skew()",local_70,&local_78);
  local_88[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x267,"void skewness_double_suite::test_left_skew()",local_88,&local_90);
  local_b0[2] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_b0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x268,"void skewness_double_suite::test_left_skew()",local_b0 + 2,local_b0 + 1);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,2.0);
  local_b0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_b8 = 1.53333;
  local_c8 = filter.sum.skewness;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26a,0x111c21,(char *)local_b0,&local_b8,in_stack_fffffffffffffe38,
             predicate_07);
  local_d0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_d8 = 0.124444;
  local_e8 = filter.sum.skewness;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26b,0x111c21,(char *)&local_d0,&local_d8,in_stack_fffffffffffffe38,
             predicate_06);
  local_f0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                       ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_f8 = 1.32288;
  local_108 = filter.sum.skewness;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26c,0x111c21,(char *)&local_f0,&local_f8,in_stack_fffffffffffffe38,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,5.0);
  local_110 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_118 = 2.84615;
  local_128 = filter.sum.skewness;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.84615","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26e,0x111c21,(char *)&local_110,&local_118,in_stack_fffffffffffffe38,
             predicate_04);
  local_130 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_138 = 2.07671;
  local_148 = filter.sum.skewness;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.07671","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26f,0x111c21,(char *)&local_130,&local_138,in_stack_fffffffffffffe38,
             predicate_03);
  local_150 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_158 = 1.45479;
  local_168 = filter.sum.skewness;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.45479","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x270,0x111c21,(char *)&local_150,&local_158,in_stack_fffffffffffffe38,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,15.0);
  local_170 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_178 = 6.5174;
  local_188 = filter.sum.skewness;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.5174","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x272,0x111c21,(char *)&local_170,&local_178,in_stack_fffffffffffffe38,
             predicate_01);
  local_190 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_198 = 27.632;
  local_1a8 = filter.sum.skewness;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","27.632","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x273,0x111c21,(char *)&local_190,&local_198,in_stack_fffffffffffffe38,
             predicate_00);
  local_1b0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_1b8 = 1.55579;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.55579","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x274,0x111c21,(char *)&local_1b0,&local_1b8,(double *)filter.sum.skewness,
             predicate);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.84615, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.07671, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.45479, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 6.5174, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 27.632, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.55579, tolerance);
}